

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_sha256.c
# Opt level: O0

uint BigEndian(uint8_t **c)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte *pbVar4;
  uint n;
  uint8_t **c_local;
  
  pbVar4 = *c;
  *c = pbVar4 + 1;
  bVar1 = *pbVar4;
  pbVar4 = *c;
  *c = pbVar4 + 1;
  bVar2 = *pbVar4;
  pbVar4 = *c;
  *c = pbVar4 + 1;
  bVar3 = *pbVar4;
  pbVar4 = *c;
  *c = pbVar4 + 1;
  return (uint)*pbVar4 | (uint)bVar3 << 8 | (uint)bVar2 << 0x10 | (uint)bVar1 << 0x18;
}

Assistant:

static inline unsigned int BigEndian(const uint8_t **c)
{
	unsigned int n = 0;

	n = (((unsigned int)(*((*c)++))) << 24);
	n |= ((unsigned int)(*((*c)++)) << 16);
	n |= ((unsigned int)(*((*c)++)) << 8);
	n |= ((unsigned int)(*((*c)++)));
	return n;
}